

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_api_v2.c
# Opt level: O3

MPP_RET hal_h265ev2_init(void *hal,MppEncHalCfg *cfg)

{
  RK_U32 RVar1;
  MPP_RET MVar2;
  MppEncHalApi *pMVar3;
  void *pvVar4;
  
  RVar1 = mpp_get_vcodec_type();
  if ((RVar1 >> 0x10 & 1) == 0) {
    _mpp_log_l(2,"hal_h265e_api_v2","vcodec type %08x can not find H.265 encoder device\n",
               (char *)0x0,(ulong)RVar1);
    _mpp_log_l(2,"hal_h265e_api_v2","Assertion %s failed at %s:%d\n",(char *)0x0,"api",
               "hal_h265ev2_init",0x4d);
    if ((mpp_debug._3_1_ & 0x10) == 0) {
      *(undefined8 *)hal = 0;
      *(undefined8 *)((long)hal + 8) = 0;
      return MPP_NOK;
    }
    abort();
  }
  RVar1 = mpp_get_client_hw_id(0x10);
  if ((int)RVar1 < 0x50603313) {
    if (RVar1 == 0x50602715) {
      pMVar3 = &hal_h265e_vepu511;
      goto LAB_0024af33;
    }
    if (RVar1 == 0x50603312) {
      pMVar3 = &hal_h265e_vepu580;
      goto LAB_0024af33;
    }
  }
  else {
    if (RVar1 == 0x506f2314) {
      pMVar3 = &hal_h265e_vepu510;
      goto LAB_0024af33;
    }
    if (RVar1 == 0x50603313) {
      pMVar3 = &hal_h265e_vepu540c;
      goto LAB_0024af33;
    }
  }
  pMVar3 = &hal_h265e_vepu541;
LAB_0024af33:
  pvVar4 = mpp_osal_calloc("hal_h265ev2_init",(ulong)pMVar3->ctx_size);
  *(MppEncHalApi **)hal = pMVar3;
  *(void **)((long)hal + 8) = pvVar4;
  MVar2 = (*pMVar3->init)(pvVar4,cfg);
  return MVar2;
}

Assistant:

static MPP_RET hal_h265ev2_init(void *hal, MppEncHalCfg *cfg)
{
    HalH265eV2Ctx *ctx = (HalH265eV2Ctx *)hal;
    const MppEncHalApi *api = NULL;
    void *hw_ctx = NULL;
    MPP_RET ret = MPP_OK;
    RK_U32 vcodec_type = mpp_get_vcodec_type();

    if (vcodec_type & HAVE_RKVENC) {
        RK_U32 hw_id = mpp_get_client_hw_id(VPU_CLIENT_RKVENC);

        switch (hw_id) {
        case HWID_VEPU58X : {
            api = &hal_h265e_vepu580;
        } break;
        case HWID_VEPU540C : {
            api = &hal_h265e_vepu540c;
        } break;
        case HWID_VEPU510 : {
            api = &hal_h265e_vepu510;
        } break;
        case HWID_VEPU511 : {
            api = &hal_h265e_vepu511;
        } break;
        default : {
            api = &hal_h265e_vepu541;
        } break;
        }
    } else {
        mpp_err("vcodec type %08x can not find H.265 encoder device\n",
                vcodec_type);
        ret = MPP_NOK;
    }

    mpp_assert(api);

    if (!ret)
        hw_ctx = mpp_calloc_size(void, api->ctx_size);

    ctx->api = api;
    ctx->hw_ctx = hw_ctx;

    if (ret)
        return ret;

    ret = api->init(hw_ctx, cfg);
    return ret;
}